

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void Console::Wrn(char *f,...)

{
  FILE *__s;
  char in_AL;
  char *__format;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_158 [8];
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  allocator local_89;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  undefined4 local_28;
  undefined4 local_24;
  va_list args;
  char *f_local;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  local_150 = in_RSI;
  local_148 = in_RDX;
  local_140 = in_RCX;
  local_138 = in_R8;
  local_130 = in_R9;
  args[0].reg_save_area = f;
  if ((Styled & 1) != 0) {
    SetTextColor(STREAM_OUT,COLOR_YELLOW,true);
  }
  __s = _stdout;
  args[0].overflow_arg_area = local_158;
  args[0]._0_8_ = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"[WRN] ",&local_89);
  std::operator+(local_68,(char *)local_88);
  std::operator+(local_48,(char *)local_68);
  __format = (char *)std::__cxx11::string::c_str();
  vfprintf(__s,__format,&local_28);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  if ((Styled & 1) != 0) {
    ResetTextColor(STREAM_OUT);
  }
  return;
}

Assistant:

void Wrn(const char* f, ...)
{
	CONSOLE_GENERIC_OUT("WRN", STREAM_OUT, COLOR_YELLOW, true);
}